

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

VectorXd __thiscall
Tools::CalculateRMSE
          (Tools *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *estimations,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *ground_truth)

{
  double dVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  size_type sVar3;
  invalid_argument *piVar4;
  size_type sVar5;
  const_reference pvVar6;
  long lVar7;
  Index IVar8;
  Scalar *pSVar9;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_RCX;
  DenseIndex extraout_RDX;
  double dVar10;
  undefined1 auVar11 [16];
  VectorXd VVar12;
  int local_e4;
  double dStack_e0;
  int i_1;
  int local_d4;
  undefined1 local_d0 [4];
  int j;
  undefined1 local_b8 [8];
  VectorXd residual;
  VectorXd cur_ground_truth;
  VectorXd current_estimate;
  Scalar SStack_80;
  int i;
  Scalar local_78;
  Scalar local_70 [3];
  Scalar local_58;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_50;
  undefined1 local_29;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_28;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *ground_truth_local;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *estimations_local;
  Tools *this_local;
  VectorXd *rmse;
  
  local_29 = 0;
  local_28 = in_RCX;
  ground_truth_local = ground_truth;
  estimations_local = estimations;
  this_local = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this,4);
  local_58 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_50,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,&local_58);
  local_70[0] = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_50,local_70);
  local_78 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,&local_78);
  SStack_80 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar2,&stack0xffffffffffffff80);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_50);
  sVar3 = std::
          vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(ground_truth_local);
  if (sVar3 == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"Error: Estimation vector size should not be zero");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar3 = std::
          vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(ground_truth_local);
  sVar5 = std::
          vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(local_28);
  if (sVar3 == sVar5) {
    for (current_estimate.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows._4_4_ = 0;
        sVar3 = std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::size(ground_truth_local),
        (ulong)(long)current_estimate.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_rows._4_4_ < sVar3;
        current_estimate.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows._4_4_ = current_estimate.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows._4_4_ + 1) {
      pvVar6 = std::
               vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator[](ground_truth_local,
                            (long)current_estimate.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &cur_ground_truth.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows,pvVar6);
      pvVar6 = std::
               vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator[](local_28,(long)current_estimate.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_rows._4_4_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,pvVar6);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_d0,
                 (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 &cur_ground_truth.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 &residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)local_b8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_d0);
      for (local_d4 = 0; lVar7 = (long)local_d4,
          IVar8 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                            ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b8),
          lVar7 < IVar8; local_d4 = local_d4 + 1) {
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_b8,
                            (long)local_d4);
        dVar10 = *pSVar9;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_b8,
                            (long)local_d4);
        dVar1 = *pSVar9;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_b8,
                            (long)local_d4);
        *pSVar9 = dVar10 * dVar1;
      }
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_b8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 &cur_ground_truth.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows);
    }
    sVar3 = std::
            vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(ground_truth_local);
    auVar11._8_4_ = (int)(sVar3 >> 0x20);
    auVar11._0_8_ = sVar3;
    auVar11._12_4_ = 0x45300000;
    dStack_e0 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,&stack0xffffffffffffff20);
    for (local_e4 = 0;
        IVar8 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this),
        local_e4 < IVar8; local_e4 = local_e4 + 1) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                          (long)local_e4);
      dVar10 = sqrt(*pSVar9);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                          (long)local_e4);
      *pSVar9 = dVar10;
    }
    VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (VectorXd)VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    ;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar4,"Error: Estimation vector size should equal ground truth size");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

VectorXd Tools::CalculateRMSE(const vector<VectorXd> &estimations,
                              const vector<VectorXd> &ground_truth) {
    VectorXd rmse(4);
    rmse << 0,0,0,0;

    if(estimations.size() < 1) {
        throw std::invalid_argument( "Error: Estimation vector size should not be zero");
    }
    else if(estimations.size() != ground_truth.size()) {
        throw std::invalid_argument( "Error: Estimation vector size should equal ground truth size");
    } else {
        //accumulate squared residuals
        for(int i=0; i < estimations.size(); ++i){
            VectorXd current_estimate = estimations[i];
            VectorXd cur_ground_truth = ground_truth[i];
            VectorXd residual = current_estimate - cur_ground_truth;
            for(int j=0; j<residual.size(); ++j) {
                residual[j] = residual[j] * residual[j];
            }
            rmse += residual;
        }

        //calculate the mean
        rmse /= estimations.size();

        //calculate the squared root
        for(int i=0; i<rmse.size(); ++i) {
            rmse[i] = sqrt(rmse[i]);
        }

        //return the result
        return rmse;
    }
}